

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O2

void fdct32_sse4_1(__m128i *input,__m128i *output,int8_t cos_bit,int8_t *stage_range)

{
  undefined7 in_register_00000011;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    av1_fdct32_sse4_1((__m128i *)((long)*input + lVar1),(__m128i *)((long)*output + lVar1),
                      (int)CONCAT71(in_register_00000011,cos_bit),8);
  }
  return;
}

Assistant:

static void fdct32_sse4_1(__m128i *input, __m128i *output, const int8_t cos_bit,
                          const int8_t *stage_range) {
  const int txfm_size = 32;
  const int num_per_128 = 4;
  int col_num = txfm_size / num_per_128;
  int col;
  (void)stage_range;
  for (col = 0; col < col_num; col++) {
    av1_fdct32_sse4_1((input + col), (output + col), cos_bit, col_num);
  }
}